

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

void __thiscall
glu::Shader::setSources(Shader *this,int numSourceStrings,char **sourceStrings,int *lengths)

{
  char *pcVar1;
  GLenum err;
  ulong local_80;
  allocator local_59;
  string local_58 [32];
  ulong local_38;
  size_t length;
  int *piStack_28;
  int ndx;
  int *lengths_local;
  char **sourceStrings_local;
  Shader *pSStack_10;
  int numSourceStrings_local;
  Shader *this_local;
  
  piStack_28 = lengths;
  lengths_local = (int *)sourceStrings;
  sourceStrings_local._4_4_ = numSourceStrings;
  pSStack_10 = this;
  (*this->m_gl->shaderSource)(this->m_shader,numSourceStrings,sourceStrings,lengths);
  err = (*this->m_gl->getError)();
  checkError(err,"glShaderSource()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x44);
  std::__cxx11::string::clear();
  for (length._4_4_ = 0; length._4_4_ < sourceStrings_local._4_4_; length._4_4_ = length._4_4_ + 1)
  {
    if ((piStack_28 == (int *)0x0) || (piStack_28[length._4_4_] < 0)) {
      local_80 = strlen(*(char **)(lengths_local + (long)length._4_4_ * 2));
    }
    else {
      local_80 = (ulong)piStack_28[length._4_4_];
    }
    local_38 = local_80;
    pcVar1 = *(char **)(lengths_local + (long)length._4_4_ * 2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar1,local_80,&local_59);
    std::__cxx11::string::operator+=((string *)&(this->m_info).source,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return;
}

Assistant:

void Shader::setSources (int numSourceStrings, const char* const* sourceStrings, const int* lengths)
{
	m_gl.shaderSource(m_shader, numSourceStrings, sourceStrings, lengths);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glShaderSource()");

	m_info.source.clear();
	for (int ndx = 0; ndx < numSourceStrings; ndx++)
	{
		const size_t length = lengths && lengths[ndx] >= 0 ? lengths[ndx] : strlen(sourceStrings[ndx]);
		m_info.source += std::string(sourceStrings[ndx], length);
	}
}